

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

void proof_chain_resolve(sat_solver2 *s,clause *cls,int Var)

{
  clause cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  clause *pcVar6;
  int iVar7;
  
  if (s->fProofLogging != 0) {
    if (s->pInt2 != (Int2_Man_t *)0x0) {
      pcVar6 = cls;
      if (cls == (clause *)0x0) {
        uVar4 = s->units[Var];
        if (uVar4 == 0) {
          pcVar6 = (clause *)0x0;
        }
        else {
          uVar2 = (s->Mem).uPageMask & uVar4;
          if (uVar2 == 0) goto LAB_008e9567;
          pcVar6 = (clause *)
                   ((s->Mem).pPages[(int)uVar4 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar2);
        }
      }
      iVar3 = Int2_ManChainResolve(s->pInt2,pcVar6,s->tempInter,(uint)s->vi[Var] >> 1 & 1);
      s->tempInter = iVar3;
    }
    if (s->pPrf2 != (Prf_Man_t *)0x0) {
      pcVar6 = cls;
      if (cls == (clause *)0x0) {
        uVar4 = s->units[Var];
        if (uVar4 == 0) {
          pcVar6 = (clause *)0x0;
        }
        else {
          uVar2 = (s->Mem).uPageMask & uVar4;
          if (uVar2 == 0) goto LAB_008e9567;
          pcVar6 = (clause *)
                   ((s->Mem).pPages[(int)uVar4 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar2);
        }
      }
      Prf_ManChainResolve(s->pPrf2,pcVar6);
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      if (cls == (clause *)0x0) {
        uVar4 = s->units[Var];
        if (uVar4 == 0) {
          cls = (clause *)0x0;
        }
        else {
          uVar2 = (s->Mem).uPageMask & uVar4;
          if (uVar2 == 0) {
LAB_008e9567:
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                          ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          cls = (clause *)
                ((s->Mem).pPages[(int)uVar4 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar2);
        }
      }
      uVar4 = (uint)s->vi[Var] >> 1 & 1;
      cVar1 = *cls;
      if (((uint)cVar1 & 1) == 0) {
        iVar3 = uVar4 * 2 + (int)cls[(ulong)((uint)cVar1 >> 0xb) + 1] * 4 + 1;
      }
      else {
        iVar3 = uVar4 * 2 + (s->claProofs).ptr[(int)cls[(ulong)((uint)cVar1 >> 0xb) + 1]] * 4;
      }
      if (iVar3 < 4) {
        __assert_fail("(ProofId >> 2) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.c"
                      ,0xcd,"void proof_chain_resolve(sat_solver2 *, clause *, int)");
      }
      uVar4 = (s->temp_proof).cap;
      if ((s->temp_proof).size == uVar4) {
        iVar7 = (uVar4 >> 1) * 3;
        if ((int)uVar4 < 4) {
          iVar7 = uVar4 * 2;
        }
        piVar5 = (s->temp_proof).ptr;
        if (piVar5 == (int *)0x0) {
          piVar5 = (int *)malloc((long)iVar7 << 2);
        }
        else {
          piVar5 = (int *)realloc(piVar5,(long)iVar7 << 2);
        }
        (s->temp_proof).ptr = piVar5;
        if (piVar5 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_proof).cap * 9.5367431640625e-07,
                 (double)iVar7 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_proof).cap = iVar7;
      }
      iVar7 = (s->temp_proof).size;
      (s->temp_proof).size = iVar7 + 1;
      (s->temp_proof).ptr[iVar7] = iVar3;
    }
  }
  return;
}

Assistant:

static inline void proof_chain_resolve( sat_solver2* s, clause* cls, int Var )
{
    if ( !s->fProofLogging )
        return;
    if ( s->pInt2 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        s->tempInter = Int2_ManChainResolve( s->pInt2, c, s->tempInter, var_is_partA(s,Var) );
    }
    if ( s->pPrf2 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        Prf_ManChainResolve( s->pPrf2, c );
    }
    if ( s->pPrf1 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        int ProofId = clause2_proofid(s, c, var_is_partA(s,Var));
        assert( (ProofId >> 2) > 0 );
        veci_push( &s->temp_proof, ProofId );
    }
}